

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O2

void so_5::impl::
     instantiator_and_sender_base<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,false>
     ::
     send_delayed<so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>>,int_const&>
               (environment_t *env,mbox_t *to,duration pause,
               outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
               *args,int *args_1)

{
  next_turn *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn_*,_false> local_28
  ;
  
  local_28._M_head_impl = in_RAX;
  details::
  make_message_instance_impl<false,so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
  ::
  make<so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>>,int_const&>
            ((make_message_instance_impl<false,so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
              *)&local_28,args,args_1);
  environment_t::single_timer<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
            (env,(type_index)&stats::impl::st_env_stuff::next_turn_handler_t::next_turn::typeinfo,
             (unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
              *)&local_28,immutable_message,to,pause);
  if (local_28._M_head_impl != (next_turn *)0x0) {
    (*((local_28._M_head_impl)->super_message_t)._vptr_message_t[1])();
  }
  return;
}

Assistant:

static void
			send_delayed(
				so_5::environment_t & env,
				const so_5::mbox_t & to,
				std::chrono::steady_clock::duration pause,
				ARGS &&... args )
				{
					env.single_timer(
							message_payload_type< MESSAGE >::subscription_type_index(),
							so_5::details::make_message_instance< MESSAGE >(
									std::forward<ARGS>(args)...),
							message_payload_type< MESSAGE >::mutability(),
							to,
							pause );
				}